

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O0

int json_patch_apply(json_object *copy_from,json_object *patch,json_object **base,
                    json_patch_error *patch_error)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  json_object *jso;
  char *__s1;
  char *path_00;
  char *path;
  char *op;
  json_object *patch_elem;
  json_object *jpath;
  json_object *jop;
  json_patch_error placeholder;
  ulong uStack_38;
  int rc;
  size_t ii;
  json_patch_error *patch_error_local;
  json_object **base_local;
  json_object *patch_local;
  json_object *copy_from_local;
  
  placeholder.errmsg._4_4_ = 0;
  ii = (size_t)patch_error;
  if (patch_error == (json_patch_error *)0x0) {
    ii = (size_t)&jop;
  }
  *(undefined8 *)(ii + 8) = 0xffffffffffffffff;
  *(undefined4 *)ii = 0;
  if (((base == (json_object **)0x0) ||
      ((*base == (json_object *)0x0 && (copy_from == (json_object *)0x0)))) ||
     ((*base != (json_object *)0x0 && (copy_from != (json_object *)0x0)))) {
    *(undefined4 *)ii = 0xe;
    *(char **)(ii + 0x10) = "Exactly one of *base or copy_from must be non-NULL";
    piVar2 = __errno_location();
    *piVar2 = 0;
    copy_from_local._4_4_ = -1;
  }
  else {
    iVar1 = json_object_is_type(patch,json_type_array);
    if (iVar1 == 0) {
      *(undefined4 *)ii = 0xe;
      *(char **)(ii + 0x10) = "Patch object is not of type json_type_array";
      piVar2 = __errno_location();
      *piVar2 = 0;
      copy_from_local._4_4_ = -1;
    }
    else if ((copy_from == (json_object *)0x0) ||
            (iVar1 = json_object_deep_copy(copy_from,base,(json_c_shallow_copy_fn *)0x0), -1 < iVar1
            )) {
      for (uStack_38 = 0; sVar3 = json_object_array_length(patch), uStack_38 < sVar3;
          uStack_38 = uStack_38 + 1) {
        jso = json_object_array_get_idx(patch,uStack_38);
        *(ulong *)(ii + 8) = uStack_38;
        iVar1 = json_object_object_get_ex(jso,"op",&jpath);
        if (iVar1 == 0) {
          *(undefined4 *)ii = 0x16;
          *(char **)(ii + 0x10) = "Patch object does not contain \'op\' field";
          piVar2 = __errno_location();
          *piVar2 = 0;
          return -1;
        }
        __s1 = json_object_get_string(jpath);
        iVar1 = json_object_object_get_ex(jso,"path",&patch_elem);
        if (iVar1 == 0) {
          *(undefined4 *)ii = 0x16;
          *(char **)(ii + 0x10) = "Patch object does not contain \'path\' field";
          piVar2 = __errno_location();
          *piVar2 = 0;
          return -1;
        }
        path_00 = json_object_get_string(patch_elem);
        iVar1 = strcmp(__s1,"test");
        if (iVar1 == 0) {
          placeholder.errmsg._4_4_ = json_patch_apply_test(base,jso,path_00,(json_patch_error *)ii);
        }
        else {
          iVar1 = strcmp(__s1,"remove");
          if (iVar1 == 0) {
            placeholder.errmsg._4_4_ = json_patch_apply_remove(base,path_00,(json_patch_error *)ii);
          }
          else {
            iVar1 = strcmp(__s1,"add");
            if (iVar1 == 0) {
              placeholder.errmsg._4_4_ =
                   json_patch_apply_add_replace(base,jso,path_00,1,(json_patch_error *)ii);
            }
            else {
              iVar1 = strcmp(__s1,"replace");
              if (iVar1 == 0) {
                placeholder.errmsg._4_4_ =
                     json_patch_apply_add_replace(base,jso,path_00,0,(json_patch_error *)ii);
              }
              else {
                iVar1 = strcmp(__s1,"move");
                if (iVar1 == 0) {
                  placeholder.errmsg._4_4_ =
                       json_patch_apply_move_copy(base,jso,path_00,1,(json_patch_error *)ii);
                }
                else {
                  iVar1 = strcmp(__s1,"copy");
                  if (iVar1 != 0) {
                    *(undefined4 *)ii = 0x16;
                    *(char **)(ii + 0x10) = "Patch object has invalid \'op\' field";
                    piVar2 = __errno_location();
                    *piVar2 = 0;
                    return -1;
                  }
                  placeholder.errmsg._4_4_ =
                       json_patch_apply_move_copy(base,jso,path_00,0,(json_patch_error *)ii);
                }
              }
            }
          }
        }
        if (placeholder.errmsg._4_4_ < 0) break;
      }
      copy_from_local._4_4_ = placeholder.errmsg._4_4_;
    }
    else {
      *(undefined4 *)ii = 0xc;
      *(char **)(ii + 0x10) = "Unable to copy copy_from using json_object_deep_copy()";
      piVar2 = __errno_location();
      *piVar2 = 0;
      copy_from_local._4_4_ = -1;
    }
  }
  return copy_from_local._4_4_;
}

Assistant:

int json_patch_apply(struct json_object *copy_from, struct json_object *patch,
                     struct json_object **base, struct json_patch_error *patch_error)
{
	size_t ii;
	int rc = 0;
	struct json_patch_error placeholder;

	if (!patch_error)
		patch_error = &placeholder;

	patch_error->patch_failure_idx = SIZE_T_MAX;
	patch_error->errno_code = 0;

	if (base == NULL|| 
	    (*base == NULL && copy_from == NULL) ||
	    (*base != NULL && copy_from != NULL))
	{
		_set_err(EFAULT, "Exactly one of *base or copy_from must be non-NULL");
		return -1;
	}
	    
	if (!json_object_is_type(patch, json_type_array)) {
		_set_err(EFAULT, "Patch object is not of type json_type_array");
		return -1;
	}

	if (copy_from != NULL)
	{
		if (json_object_deep_copy(copy_from, base, NULL) < 0)
		{
			_set_err(ENOMEM, "Unable to copy copy_from using json_object_deep_copy()");
			return -1;
		}
	}

	/* Go through all operations ; apply them on res */
	for (ii = 0; ii < json_object_array_length(patch); ii++) {
		struct json_object *jop, *jpath;
		struct json_object *patch_elem = json_object_array_get_idx(patch, ii);
		const char *op, *path;

		patch_error->patch_failure_idx = ii;

		if (!json_object_object_get_ex(patch_elem, "op", &jop)) {
			_set_err(EINVAL, "Patch object does not contain 'op' field");
			return -1;
		}
		op = json_object_get_string(jop);
		if (!json_object_object_get_ex(patch_elem, "path", &jpath)) {
			_set_err(EINVAL, "Patch object does not contain 'path' field");
			return -1;
		}
		path = json_object_get_string(jpath); // Note: empty string is ok!

		if (!strcmp(op, "test"))
			rc = json_patch_apply_test(base, patch_elem, path, patch_error);
		else if (!strcmp(op, "remove"))
			rc = json_patch_apply_remove(base, path, patch_error);
		else if (!strcmp(op, "add"))
			rc = json_patch_apply_add_replace(base, patch_elem, path, 1, patch_error);
		else if (!strcmp(op, "replace"))
			rc = json_patch_apply_add_replace(base, patch_elem, path, 0, patch_error);
		else if (!strcmp(op, "move"))
			rc = json_patch_apply_move_copy(base, patch_elem, path, 1, patch_error);
		else if (!strcmp(op, "copy"))
			rc = json_patch_apply_move_copy(base, patch_elem, path, 0, patch_error);
		else {
			_set_err(EINVAL, "Patch object has invalid 'op' field");
			return -1;
		}
		if (rc < 0)
			break;
	}

	return rc;
}